

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Maybe<kj::Promise<void_*>_> __thiscall
capnp::LocalClient::getLocalServer(LocalClient *this,CapabilityServerSetBase *capServerSet)

{
  long in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 aVar1;
  Maybe<kj::Promise<void_*>_> MVar2;
  Promise<void_*> local_50 [3];
  CapabilityServerSetBase *local_38;
  Promise<void> local_30;
  Promise<void> local_28 [2];
  CapabilityServerSetBase *capServerSet_local;
  LocalClient *this_local;
  
  capServerSet_local = capServerSet;
  this_local = this;
  if (*(long *)(capServerSet + 0x30) == in_RDX) {
    if (((byte)capServerSet[0x78] & 1) == 0) {
      kj::Promise<void_*>::Promise(local_50,*(FixVoid<void_*> *)(capServerSet + 0x38));
      kj::Maybe<kj::Promise<void_*>_>::Maybe((Maybe<kj::Promise<void_*>_> *)this,local_50);
      kj::Promise<void_*>::~Promise(local_50);
      aVar1 = extraout_RDX_00;
    }
    else {
      kj::newAdaptedPromise<kj::Promise<void>,capnp::LocalClient::BlockedCall,capnp::LocalClient&>
                ((kj *)&local_30,(LocalClient *)capServerSet);
      local_38 = capServerSet;
      kj::Promise<void>::
      then<capnp::LocalClient::getLocalServer(capnp::_::CapabilityServerSetBase&)::_lambda()_1_>
                (local_28,(Type *)&local_30);
      kj::Maybe<kj::Promise<void_*>_>::Maybe
                ((Maybe<kj::Promise<void_*>_> *)this,(Promise<void_*> *)local_28);
      kj::Promise<void_*>::~Promise((Promise<void_*> *)local_28);
      kj::Promise<void>::~Promise(&local_30);
      aVar1 = extraout_RDX;
    }
  }
  else {
    kj::Maybe<kj::Promise<void_*>_>::Maybe((Maybe<kj::Promise<void_*>_> *)this);
    aVar1 = extraout_RDX_01;
  }
  MVar2.ptr.field_1 = aVar1;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<void_*>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<void*>> getLocalServer(_::CapabilityServerSetBase& capServerSet) {
    // If this is a local capability created through `capServerSet`, return the underlying Server.
    // Otherwise, return nullptr. Default implementation (which everyone except LocalClient should
    // use) always returns nullptr.

    if (this->capServerSet == &capServerSet) {
      if (blocked) {
        // If streaming calls are in-flight, it could be the case that they were originally sent
        // over RPC and reflected back, before the capability had resolved to a local object. In
        // that case, the client may already perceive these calls as "done" because the RPC
        // implementation caused the client promise to resolve early. However, the capability is
        // now local, and the app is trying to break through the LocalClient wrapper and access
        // the server directly, bypassing the stream queue. Since the app thinks that all
        // previous calls already completed, it may then try to queue a new call directly on the
        // server, jumping the queue.
        //
        // We can solve this by delaying getLocalServer() until all current streaming calls have
        // finished. Note that if a new streaming call is started *after* this point, we need not
        // worry about that, because in this case it is presumably a local call and the caller
        // won't be informed of completion until the call actually does complete. Thus the caller
        // is well-aware that this call is still in-flight.
        //
        // However, the app still cannot assume that there aren't multiple clients, perhaps even
        // a malicious client that tries to send stream requests that overlap with the app's
        // direct use of the server... so it's up to the app to check for and guard against
        // concurrent calls after using getLocalServer().
        return kj::newAdaptedPromise<kj::Promise<void>, BlockedCall>(*this)
            .then([this]() { return ptr; });
      } else {
        return kj::Promise<void*>(ptr);
      }
    } else {
      return kj::none;
    }
  }